

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allmain.c
# Opt level: O2

void stop_occupation(void)

{
  boolean bVar1;
  
  if (occupation != (_func_int *)0x0) {
    bVar1 = maybe_finished_meal('\x01');
    if (bVar1 == '\0') {
      pline("You stop %s.");
    }
    occupation = (_func_int *)0x0;
    iflags.botl = '\x01';
  }
  nomul(0,(char *)0x0);
  return;
}

Assistant:

void stop_occupation(void)
{
    if (occupation) {
	if (!maybe_finished_meal(TRUE))
	    pline("You stop %s.", occtxt);
	occupation = 0;
	iflags.botl = 1; /* in case u.uhs changed */
	/* fainting stops your occupation, there's no reason to sync.
	sync_hunger();
	 */
    }
    nomul(0, NULL); /* running, travel and autotravel don't count as occupations */
}